

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_GenFsm(char *pFileName,int nPis,int nPos,int nStates,int nLines,int ProbI,int ProbO)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  word *pwVar5;
  Vec_Str_t *vCond;
  FILE *__stream;
  char *pcVar6;
  word wVar7;
  undefined4 in_register_0000008c;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  char *local_60;
  
  uVar1 = (ulong)(uint)nLines;
  uVar2 = Abc_Base10Log(nStates);
  Aig_ManRandom(1);
  p = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < nLines - 1U) {
    iVar9 = nLines;
  }
  p->nSize = 0;
  p->nCap = iVar9;
  uVar10 = 0;
  if (iVar9 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar9 << 3);
  }
  p->pArray = pwVar5;
  vCond = (Vec_Str_t *)malloc(0x10);
  vCond->nCap = 1000;
  vCond->nSize = 0;
  local_60 = (char *)malloc(1000);
  vCond->pArray = local_60;
  uVar8 = 0;
  if (0 < nStates) {
    uVar8 = (ulong)(uint)nStates;
  }
  for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    do {
      uVar3 = Aig_ManRandom(0);
    } while (uVar10 == (ulong)uVar3 % (ulong)(uint)nStates);
    Vec_WrdPush(p,(long)(int)((ulong)uVar3 % (ulong)(uint)nStates) | uVar10 << 0x20);
  }
  for (; (int)uVar8 < nLines; uVar8 = (ulong)((int)uVar8 + 1)) {
    do {
      uVar3 = Aig_ManRandom(0);
      uVar4 = Aig_ManRandom(0);
    } while (uVar4 % (uint)nStates == (uint)((ulong)uVar3 % (ulong)(uint)nStates));
    Vec_WrdPush(p,(long)(int)(uVar4 % (uint)nStates) | (ulong)uVar3 % (ulong)(uint)nStates << 0x20);
  }
  pwVar5 = p->pArray;
  qsort(pwVar5,(long)p->nSize,8,Vec_WrdSortCompare1);
  __stream = fopen(pFileName,"w");
  pcVar6 = Extra_TimeStamp();
  fprintf(__stream,"# This random FSM was generated by ABC on %s\n",pcVar6);
  fprintf(__stream,"# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n",
          (ulong)(uint)nPis,(ulong)(uint)nPos,(ulong)(uint)nStates,uVar1,
          CONCAT44(in_register_0000008c,ProbI),(ulong)(uint)ProbO,pFileName);
  fprintf(__stream,"# FSM has %d inputs, %d outputs, %d states, and %d products\n",(ulong)(uint)nPis
          ,(ulong)(uint)nPos,(ulong)(uint)nStates,uVar1);
  fprintf(__stream,".i %d\n",(ulong)(uint)nPis);
  fprintf(__stream,".o %d\n",(ulong)(uint)nPos);
  fprintf(__stream,".p %d\n",uVar1);
  fprintf(__stream,".s %d\n",(ulong)(uint)nStates);
  if (nLines < 1) {
    nLines = 0;
  }
  for (iVar9 = 0; nLines != iVar9; iVar9 = iVar9 + 1) {
    Abc_GenFsmCond(vCond,nPis,ProbI);
    local_60 = vCond->pArray;
    fprintf(__stream,"%s ");
    wVar7 = Vec_WrdEntry(p,iVar9);
    fprintf(__stream,"%0*d ",(ulong)uVar2,wVar7 >> 0x20);
    wVar7 = Vec_WrdEntry(p,iVar9);
    fprintf(__stream,"%0*d ",(ulong)uVar2,wVar7 & 0xffffffff);
    if (0 < nPos) {
      Abc_GenFsmCond(vCond,nPos,ProbO);
      local_60 = vCond->pArray;
      fputs(local_60,__stream);
    }
    fputc(10,__stream);
  }
  fwrite(".e",2,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  free(pwVar5);
  free(p);
  free(local_60);
  free(vCond);
  return;
}

Assistant:

void Abc_GenFsm( char * pFileName, int nPis, int nPos, int nStates, int nLines, int ProbI, int ProbO )
{
    FILE * pFile;
    Vec_Wrd_t * vStates;
    Vec_Str_t * vCond;
    int i, iState, iState2;
    int nDigits = Abc_Base10Log( nStates );
    Aig_ManRandom( 1 );
    vStates = Vec_WrdAlloc( nLines );
    vCond = Vec_StrAlloc( 1000 );
    for ( i = 0; i < nStates; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        if ( iState == i )
            continue;
        Vec_WrdPush( vStates, ((word)i << 32) | iState );
        i++;
    }
    for (      ; i < nLines; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        iState2 = Aig_ManRandom( 0 ) % nStates;
        if ( iState2 == iState )
            continue;
        Vec_WrdPush( vStates, ((word)iState << 32) | iState2 );
        i++;
    }
    Vec_WrdSort( vStates, 0 );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# This random FSM was generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n", nPis, nPos, nStates, nLines, ProbI, ProbO, pFileName );
    fprintf( pFile, "# FSM has %d inputs, %d outputs, %d states, and %d products\n", nPis, nPos, nStates, nLines );
    fprintf( pFile, ".i %d\n", nPis );
    fprintf( pFile, ".o %d\n", nPos );
    fprintf( pFile, ".p %d\n", nLines );
    fprintf( pFile, ".s %d\n", nStates );
    for ( i = 0; i < nLines; i++ )
    {
        Abc_GenFsmCond( vCond, nPis, ProbI );
        fprintf( pFile, "%s ", Vec_StrArray(vCond) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i) >> 32) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i)) );
        if ( nPos > 0 )
        {
            Abc_GenFsmCond( vCond, nPos, ProbO );
            fprintf( pFile, "%s", Vec_StrArray(vCond) );
        }
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e" );
    fprintf( pFile, "\n" );
    fclose( pFile );
    Vec_WrdFree( vStates );
    Vec_StrFree( vCond );
}